

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O1

bool __thiscall DefaultNavigationKeys::PageUp(DefaultNavigationKeys *this,string *key)

{
  int iVar1;
  bool bVar2;
  long *local_30;
  size_t local_28;
  long local_20 [2];
  
  (**(code **)((long)*this + 0x90))(&local_30,this);
  if (local_28 == key->_M_string_length) {
    if (local_28 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_30,(key->_M_dataplus)._M_p,local_28);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return bVar2;
}

Assistant:

virtual bool PageUp(const std::string& key) override { return PageUp() == key; }